

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmpar_.c
# Opt level: O0

void lmpar_(int *n,double *r__,int *ldr,int *ipvt,double *diag,double *qtb,double *delta,double *par
           ,double *x,double *sdiag,double *wa1,double *wa2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_RCX;
  int *in_RDX;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  double *n_00;
  double dVar7;
  int *n_01;
  double dVar8;
  int *piVar9;
  double *in_stack_00000008;
  double *in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  double dxnorm;
  double gnorm;
  int nsing;
  double dwarf;
  double paru;
  double temp;
  int iter;
  double parl;
  double parc;
  double sum;
  int jp1;
  int jm1;
  double fp;
  int l;
  int k;
  int j;
  int i__;
  double d__2;
  double d__1;
  int i__2;
  int i__1;
  int r_offset;
  int r_dim1;
  int c__2;
  double *local_110;
  double local_108;
  int *local_f8;
  double *local_f0;
  double local_e8;
  double *local_e0;
  double local_d8;
  undefined4 in_stack_ffffffffffffff48;
  double local_a8;
  undefined4 in_stack_ffffffffffffff68;
  int iVar10;
  double *diag_00;
  int *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_64;
  int iVar11;
  int in_stack_ffffffffffffffa4;
  double *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  int *local_8;
  
  local_34 = 2;
  in_stack_00000030 = in_stack_00000030 + -8;
  lVar5 = in_stack_00000028 + -8;
  lVar6 = in_stack_00000018 + -8;
  local_30 = in_R9 + -8;
  local_28 = in_R8 + -8;
  local_20 = in_RCX + -4;
  iVar1 = *in_RDX;
  local_10 = in_RSI + (long)(iVar1 + 1) * -8;
  local_8 = in_RDI;
  n_00 = (double *)dpmpar_(&local_34);
  iVar3 = *local_8;
  iVar4 = *local_8;
  for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
    *(undefined8 *)(lVar5 + (long)iVar11 * 8) = *(undefined8 *)(local_30 + (long)iVar11 * 8);
    dVar7 = *(double *)(local_10 + (long)(iVar11 + iVar11 * iVar1) * 8);
    if (((dVar7 == 0.0) && (!NAN(dVar7))) && (iVar3 == *local_8)) {
      iVar3 = iVar11 + -1;
    }
    if (iVar3 < *local_8) {
      *(undefined8 *)(lVar5 + (long)iVar11 * 8) = 0;
    }
  }
  if (0 < iVar3) {
    for (local_64 = 1; local_64 <= iVar3; local_64 = local_64 + 1) {
      in_stack_ffffffffffffff8c = iVar3 - local_64;
      iVar4 = in_stack_ffffffffffffff8c + 1;
      *(double *)(lVar5 + (long)iVar4 * 8) =
           *(double *)(lVar5 + (long)iVar4 * 8) /
           *(double *)(local_10 + (long)(iVar4 + iVar4 * iVar1) * 8);
      dVar7 = *(double *)(lVar5 + (long)iVar4 * 8);
      if (0 < in_stack_ffffffffffffff8c) {
        for (in_stack_ffffffffffffffa4 = 1; in_stack_ffffffffffffffa4 <= in_stack_ffffffffffffff8c;
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          *(double *)(lVar5 + (long)in_stack_ffffffffffffffa4 * 8) =
               -*(double *)(local_10 + (long)(in_stack_ffffffffffffffa4 + iVar4 * iVar1) * 8) *
               dVar7 + *(double *)(lVar5 + (long)in_stack_ffffffffffffffa4 * 8);
        }
      }
    }
  }
  iVar4 = *local_8;
  for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
    *(undefined8 *)(lVar6 + (long)*(int *)(local_20 + (long)iVar11 * 4) * 8) =
         *(undefined8 *)(lVar5 + (long)iVar11 * 8);
  }
  iVar10 = 0;
  iVar4 = *local_8;
  for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
    *(double *)(in_stack_00000030 + (long)iVar11 * 8) =
         *(double *)(local_28 + (long)iVar11 * 8) * *(double *)(lVar6 + (long)iVar11 * 8);
  }
  dVar7 = enorm_((int *)n_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
  n_01 = (int *)(dVar7 - *in_stack_00000008);
  if (*in_stack_00000008 * 0.1 < (double)n_01) {
    diag_00 = (double *)0x0;
    if (*local_8 <= iVar3) {
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        iVar2 = *(int *)(local_20 + (long)iVar11 * 4);
        *(double *)(lVar5 + (long)iVar11 * 8) =
             *(double *)(local_28 + (long)iVar2 * 8) *
             (*(double *)(in_stack_00000030 + (long)iVar2 * 8) / dVar7);
      }
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        in_stack_ffffffffffffff80 = (int *)0x0;
        in_stack_ffffffffffffff8c = iVar11 + -1;
        if (0 < in_stack_ffffffffffffff8c) {
          for (in_stack_ffffffffffffffa4 = 1; in_stack_ffffffffffffffa4 <= in_stack_ffffffffffffff8c
              ; in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
            in_stack_ffffffffffffff80 =
                 (int *)(*(double *)
                          (local_10 + (long)(in_stack_ffffffffffffffa4 + iVar11 * iVar1) * 8) *
                         *(double *)(lVar5 + (long)in_stack_ffffffffffffffa4 * 8) +
                        (double)in_stack_ffffffffffffff80);
          }
        }
        *(double *)(lVar5 + (long)iVar11 * 8) =
             (*(double *)(lVar5 + (long)iVar11 * 8) - (double)in_stack_ffffffffffffff80) /
             *(double *)(local_10 + (long)(iVar11 + iVar11 * iVar1) * 8);
      }
      dVar8 = enorm_((int *)n_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
      diag_00 = (double *)((((double)n_01 / *in_stack_00000008) / dVar8) / dVar8);
    }
    iVar4 = *local_8;
    for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
      in_stack_ffffffffffffff80 = (int *)0x0;
      for (in_stack_ffffffffffffffa4 = 1; in_stack_ffffffffffffffa4 <= iVar11;
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
        in_stack_ffffffffffffff80 =
             (int *)(*(double *)(local_10 + (long)(in_stack_ffffffffffffffa4 + iVar11 * iVar1) * 8)
                     * *(double *)(local_30 + (long)in_stack_ffffffffffffffa4 * 8) +
                    (double)in_stack_ffffffffffffff80);
      }
      *(double *)(lVar5 + (long)iVar11 * 8) =
           (double)in_stack_ffffffffffffff80 /
           *(double *)(local_28 + (long)*(int *)(local_20 + (long)iVar11 * 4) * 8);
    }
    dVar8 = enorm_((int *)n_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
    local_a8 = dVar8 / *in_stack_00000008;
    if ((local_a8 == 0.0) && (!NAN(local_a8))) {
      if (0.1 < *in_stack_00000008) {
        local_d8 = 0.1;
      }
      else {
        local_d8 = *in_stack_00000008;
      }
      local_a8 = (double)n_00 / local_d8;
    }
    local_e0 = diag_00;
    if ((double)diag_00 <= *in_stack_00000010) {
      local_e0 = (double *)*in_stack_00000010;
    }
    *in_stack_00000010 = (double)local_e0;
    if (local_a8 < *in_stack_00000010) {
      local_e8 = local_a8;
    }
    else {
      local_e8 = *in_stack_00000010;
    }
    *in_stack_00000010 = local_e8;
    if ((*in_stack_00000010 == 0.0) && (!NAN(*in_stack_00000010))) {
      *in_stack_00000010 = dVar8 / dVar7;
    }
    while( true ) {
      iVar10 = iVar10 + 1;
      if ((*in_stack_00000010 == 0.0) && (!NAN(*in_stack_00000010))) {
        in_stack_ffffffffffffffa8 = (double *)(local_a8 * 0.001);
        local_f0 = in_stack_ffffffffffffffa8;
        if ((double)in_stack_ffffffffffffffa8 <= (double)n_00) {
          local_f0 = n_00;
        }
        *in_stack_00000010 = (double)local_f0;
        in_stack_ffffffffffffffb0 = n_00;
      }
      dVar7 = sqrt(*in_stack_00000010);
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        *(double *)(lVar5 + (long)iVar11 * 8) = dVar7 * *(double *)(local_28 + (long)iVar11 * 8);
      }
      qrsolv_(n_01,(double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,diag_00,
              (double *)CONCAT44(iVar10,in_stack_ffffffffffffff68),
              (double *)CONCAT44(in_stack_ffffffffffffffa4,iVar11),in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffb0);
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        *(double *)(in_stack_00000030 + (long)iVar11 * 8) =
             *(double *)(local_28 + (long)iVar11 * 8) * *(double *)(lVar6 + (long)iVar11 * 8);
      }
      dVar7 = enorm_((int *)n_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
      piVar9 = (int *)(dVar7 - *in_stack_00000008);
      local_f8 = piVar9;
      if ((double)piVar9 < 0.0) {
        local_f8 = (int *)-(double)piVar9;
      }
      if ((((double)local_f8 <= *in_stack_00000008 * 0.1) ||
          (((((double)diag_00 == 0.0 && (!NAN((double)diag_00))) && ((double)piVar9 <= (double)n_01)
            ) && ((double)n_01 < 0.0)))) || (iVar10 == 10)) break;
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        iVar2 = *(int *)(local_20 + (long)iVar11 * 4);
        *(double *)(lVar5 + (long)iVar11 * 8) =
             *(double *)(local_28 + (long)iVar2 * 8) *
             (*(double *)(in_stack_00000030 + (long)iVar2 * 8) / dVar7);
      }
      iVar4 = *local_8;
      for (iVar11 = 1; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
        *(double *)(lVar5 + (long)iVar11 * 8) =
             *(double *)(lVar5 + (long)iVar11 * 8) /
             *(double *)(in_stack_00000020 + -8 + (long)iVar11 * 8);
        dVar7 = *(double *)(lVar5 + (long)iVar11 * 8);
        in_stack_ffffffffffffff88 = iVar11 + 1;
        if (in_stack_ffffffffffffff88 <= *local_8) {
          iVar2 = *local_8;
          for (in_stack_ffffffffffffffa4 = in_stack_ffffffffffffff88;
              in_stack_ffffffffffffffa4 <= iVar2;
              in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
            *(double *)(lVar5 + (long)in_stack_ffffffffffffffa4 * 8) =
                 -*(double *)(local_10 + (long)(in_stack_ffffffffffffffa4 + iVar11 * iVar1) * 8) *
                 dVar7 + *(double *)(lVar5 + (long)in_stack_ffffffffffffffa4 * 8);
          }
        }
      }
      dVar7 = enorm_((int *)n_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff78 = (int *)((((double)piVar9 / *in_stack_00000008) / dVar7) / dVar7);
      if ((0.0 < (double)piVar9) && ((double)diag_00 < *in_stack_00000010)) {
        diag_00 = (double *)*in_stack_00000010;
      }
      if ((double)piVar9 < 0.0) {
        if (*in_stack_00000010 < local_a8) {
          local_108 = *in_stack_00000010;
        }
        else {
          local_108 = local_a8;
        }
        local_a8 = local_108;
      }
      in_stack_ffffffffffffffa8 = (double *)(*in_stack_00000010 + (double)in_stack_ffffffffffffff78)
      ;
      local_110 = in_stack_ffffffffffffffa8;
      if ((double)in_stack_ffffffffffffffa8 <= (double)diag_00) {
        local_110 = diag_00;
      }
      *in_stack_00000010 = (double)local_110;
      n_01 = piVar9;
      in_stack_ffffffffffffffb0 = diag_00;
    }
  }
  if (iVar10 == 0) {
    *in_stack_00000010 = 0.0;
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(lmpar)(const int *n, real *r__, const int *ldr, 
	const int *ipvt, const real *diag, const real *qtb, const real *delta, 
	real *par, real *x, real *sdiag, real *wa1, 
	real *wa2)
{
    /* Table of constant values */

    const int c__2 = 2;

    /* Initialized data */

#define p1 ((real).1)
#define p001 ((real).001)

    /* System generated locals */
    int r_dim1, r_offset, i__1, i__2;
    real d__1, d__2;

    /* Local variables */
    int i__, j, k, l;
    real fp;
    int jm1, jp1;
    real sum, parc, parl;
    int iter;
    real temp, paru, dwarf;
    int nsing;
    real gnorm;
    real dxnorm;

/*     ********** */

/*     subroutine lmpar */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, */
/*     the problem is to determine a value for the parameter */
/*     par such that if x solves the system */

/*           a*x = b ,     sqrt(par)*d*x = 0 , */

/*     in the least squares sense, and dxnorm is the euclidean */
/*     norm of d*x, then either par is zero and */

/*           (dxnorm-delta) .le. 0.1*delta , */

/*     or par is positive and */

/*           abs(dxnorm-delta) .le. 0.1*delta . */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization, with column pivoting, of a. that is, if */
/*     a*p = q*r, where p is a permutation matrix, q has orthogonal */
/*     columns, and r is an upper triangular matrix with diagonal */
/*     elements of nonincreasing magnitude, then lmpar expects */
/*     the full upper triangle of r, the permutation matrix p, */
/*     and the first n components of (q transpose)*b. on output */
/*     lmpar also provides an upper triangular matrix s such that */

/*            t   t                   t */
/*           p *(a *a + par*d*d)*p = s *s . */

/*     s is employed within lmpar and may be of separate interest. */

/*     only a few iterations are generally needed for convergence */
/*     of the algorithm. if, however, the limit of 10 iterations */
/*     is reached, then the output par will contain the best */
/*     value obtained so far. */

/*     the subroutine statement is */

/*       subroutine lmpar(n,r,ldr,ipvt,diag,qtb,delta,par,x,sdiag, */
/*                        wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an n by n array. on input the full upper triangle */
/*         must contain the full upper triangle of the matrix r. */
/*         on output the full upper triangle is unaltered, and the */
/*         strict lower triangle contains the strict upper triangle */
/*         (transposed) of the upper triangular matrix s. */

/*       ldr is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array r. */

/*       ipvt is an integer input array of length n which defines the */
/*         permutation matrix p such that a*p = q*r. column j of p */
/*         is column ipvt(j) of the identity matrix. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       par is a nonnegative variable. on input par contains an */
/*         initial estimate of the levenberg-marquardt parameter. */
/*         on output par contains the final estimate. */

/*       x is an output array of length n which contains the least */
/*         squares solution of the system a*x = b, sqrt(par)*d*x = 0, */
/*         for the output par. */

/*       sdiag is an output array of length n which contains the */
/*         diagonal elements of the upper triangular matrix s. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm,qrsolv */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --sdiag;
    --x;
    --qtb;
    --diag;
    --ipvt;
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1 * 1;
    r__ -= r_offset;

    /* Function Body */

/*     dwarf is the smallest positive magnitude. */

    dwarf = __minpack_func__(dpmpar)(&c__2);

/*     compute and store in x the gauss-newton direction. if the */
/*     jacobian is rank-deficient, obtain a least squares solution. */

    nsing = *n;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = qtb[j];
	if (r__[j + j * r_dim1] == 0. && nsing == *n) {
	    nsing = j - 1;
	}
	if (nsing < *n) {
	    wa1[j] = 0.;
	}
/* L10: */
    }
    if (nsing < 1) {
	goto L50;
    }
    i__1 = nsing;
    for (k = 1; k <= i__1; ++k) {
	j = nsing - k + 1;
	wa1[j] /= r__[j + j * r_dim1];
	temp = wa1[j];
	jm1 = j - 1;
	if (jm1 < 1) {
	    goto L30;
	}
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/* L20: */
	}
L30:
/* L40: */
	;
    }
L50:
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	x[l] = wa1[j];
/* L60: */
    }

/*     initialize the iteration counter. */
/*     evaluate the function at the origin, and test */
/*     for acceptance of the gauss-newton direction. */

    iter = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa2[j] = diag[j] * x[j];
/* L70: */
    }
    dxnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fp = dxnorm - *delta;
    if (fp <= p1 * *delta) {
	goto L220;
    }

/*     if the jacobian is not rank deficient, the newton */
/*     step provides a lower bound, parl, for the zero of */
/*     the function. otherwise set this bound to zero. */

    parl = 0.;
    if (nsing < *n) {
	goto L120;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/* L80: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sum = 0.;
	jm1 = j - 1;
	if (jm1 < 1) {
	    goto L100;
	}
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += r__[i__ + j * r_dim1] * wa1[i__];
/* L90: */
	}
L100:
	wa1[j] = (wa1[j] - sum) / r__[j + j * r_dim1];
/* L110: */
    }
    temp = __minpack_func__(enorm)(n, &wa1[1]);
    parl = fp / *delta / temp / temp;
L120:

/*     calculate an upper bound, paru, for the zero of the function. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sum = 0.;
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += r__[i__ + j * r_dim1] * qtb[i__];
/* L130: */
	}
	l = ipvt[j];
	wa1[j] = sum / diag[l];
/* L140: */
    }
    gnorm = __minpack_func__(enorm)(n, &wa1[1]);
    paru = gnorm / *delta;
    if (paru == 0.) {
	paru = dwarf / min(*delta,(real)p1);
    }

/*     if the input par lies outside of the interval (parl,paru), */
/*     set par to the closer endpoint. */

    *par = max(*par,parl);
    *par = min(*par,paru);
    if (*par == 0.) {
	*par = gnorm / dxnorm;
    }

/*     beginning of an iteration. */

L150:
    ++iter;

/*        evaluate the function at the current value of par. */

    if (*par == 0.) {
/* Computing MAX */
	d__1 = dwarf, d__2 = p001 * paru;
	*par = max(d__1,d__2);
    }
    temp = sqrt(*par);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = temp * diag[j];
/* L160: */
    }
    __minpack_func__(qrsolv)(n, &r__[r_offset], ldr, &ipvt[1], &wa1[1], &qtb[1], &x[1], &sdiag[
	    1], &wa2[1]);
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa2[j] = diag[j] * x[j];
/* L170: */
    }
    dxnorm = __minpack_func__(enorm)(n, &wa2[1]);
    temp = fp;
    fp = dxnorm - *delta;

/*        if the function is small enough, accept the current value */
/*        of par. also test for the exceptional cases where parl */
/*        is zero or the number of iterations has reached 10. */

    if (abs(fp) <= p1 * *delta || (parl == 0. && fp <= temp && temp < 0.) ||
	     iter == 10) {
	goto L220;
    }

/*        compute the newton correction. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/* L180: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] /= sdiag[j];
	temp = wa1[j];
	jp1 = j + 1;
	if (*n < jp1) {
	    goto L200;
	}
	i__2 = *n;
	for (i__ = jp1; i__ <= i__2; ++i__) {
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/* L190: */
	}
L200:
/* L210: */
	;
    }
    temp = __minpack_func__(enorm)(n, &wa1[1]);
    parc = fp / *delta / temp / temp;

/*        depending on the sign of the function, update parl or paru. */

    if (fp > 0.) {
	parl = max(parl,*par);
    }
    if (fp < 0.) {
	paru = min(paru,*par);
    }

/*        compute an improved estimate for par. */

/* Computing MAX */
    d__1 = parl, d__2 = *par + parc;
    *par = max(d__1,d__2);

/*        end of an iteration. */

    goto L150;
L220:

/*     termination. */

    if (iter == 0) {
	*par = 0.;
    }
    return;

/*     last card of subroutine lmpar. */

}